

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void jx9DelimitNestedTokens
               (SyToken *pIn,SyToken *pEnd,sxu32 nTokStart,sxu32 nTokEnd,SyToken **ppEnd)

{
  int local_34;
  SyToken *pSStack_30;
  sxi32 iNest;
  SyToken *pCur;
  SyToken **ppEnd_local;
  sxu32 nTokEnd_local;
  sxu32 nTokStart_local;
  SyToken *pEnd_local;
  SyToken *pIn_local;
  
  local_34 = 1;
  for (pSStack_30 = pIn; pSStack_30 < pEnd; pSStack_30 = pSStack_30 + 1) {
    if ((pSStack_30->nType & nTokStart) == 0) {
      if (((pSStack_30->nType & nTokEnd) != 0) && (local_34 = local_34 + -1, local_34 < 1)) break;
    }
    else {
      local_34 = local_34 + 1;
    }
  }
  *ppEnd = pSStack_30;
  return;
}

Assistant:

JX9_PRIVATE void jx9DelimitNestedTokens(SyToken *pIn,SyToken *pEnd,sxu32 nTokStart,sxu32 nTokEnd,SyToken **ppEnd)
{
	SyToken *pCur = pIn;
	sxi32 iNest = 1;
	for(;;){
		if( pCur >= pEnd ){
			break;
		}
		if( pCur->nType & nTokStart ){
			/* Increment nesting level */
			iNest++;
		}else if( pCur->nType & nTokEnd ){
			/* Decrement nesting level */
			iNest--;
			if( iNest <= 0 ){
				break;
			}
		}
		/* Advance cursor */
		pCur++;
	}
	/* Point to the end of the chunk */
	*ppEnd = pCur;
}